

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::diffuse_scalar_fj
          (PeleLM *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int num_comp,int Rho_comp,Real prev_time,Real a_time,Real a_be_cn_theta,MultiFab *rho_mid,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,Vector<double,_std::allocator<double>_> *a_visc_coef,int a_visc_coef_comp,
          MultiFab *theVolume,MultiFab **theArea,IntVect *cratio,BCRec *bc,Geometry *theGeom,
          bool add_hoop_stress,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *diffuse_this_comp)

{
  int iVar1;
  int *piVar2;
  Long LVar3;
  FabArrayBase *pFVar4;
  void *pvVar5;
  bool bVar6;
  int in_stack_00000008;
  int in_stack_00000020;
  FabArrayBase *in_stack_00000040;
  int in_stack_00000048;
  FabArrayBase *in_stack_00000050;
  int in_stack_00000058;
  byte in_stack_000000b0;
  byte in_stack_000000b8;
  bool has_betanp1;
  bool has_betan;
  int allthere;
  int allnull;
  MultiFab *Alpha;
  bool has_alpha_in;
  MultiFab *Rhs;
  bool has_delta_rhs;
  MultiFab *Rho_new_crse;
  MultiFab *Rho_old_crse;
  MultiFab *S_new_crse;
  MultiFab *S_old_crse;
  bool has_coarse_data;
  int ng;
  MultiFab Rho_new_fine;
  MultiFab Rho_old_fine;
  MultiFab S_new_fine;
  MultiFab S_old_fine;
  ForkJoin fj;
  int n_tasks;
  int n_tasks_suggest;
  int n_procs;
  undefined1 in_stack_00001fe7;
  Real in_stack_00001fe8;
  Real in_stack_00001ff0;
  Real in_stack_00001ff8;
  int in_stack_00002004;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00002008;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00002010;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00002018;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00002020;
  Diffusion *in_stack_00002028;
  int in_stack_00002070;
  int in_stack_00002078;
  MultiFab *in_stack_00002080;
  int in_stack_00002088;
  MultiFab **in_stack_00002090;
  MultiFab **in_stack_00002098;
  int in_stack_000020a0;
  MultiFab *in_stack_000020a8;
  int in_stack_000020b0;
  MultiFab *in_stack_000020b8;
  int in_stack_000020c0;
  MultiFab **in_stack_000020c8;
  MultiFab **in_stack_000020d0;
  int in_stack_000020d8;
  IntVect *in_stack_000020e0;
  BCRec *in_stack_000020e8;
  Geometry *in_stack_000020f0;
  Vector<int,_std::allocator<int>_> *in_stack_00002100;
  undefined4 in_stack_fffffffffffff038;
  int in_stack_fffffffffffff03c;
  int in_stack_fffffffffffff040;
  MakeType in_stack_fffffffffffff044;
  MultiFab *in_stack_fffffffffffff048;
  undefined4 in_stack_fffffffffffff050;
  int in_stack_fffffffffffff054;
  MultiFab *in_stack_fffffffffffff058;
  ForkJoin *in_stack_fffffffffffff060;
  undefined4 in_stack_fffffffffffff068;
  undefined4 in_stack_fffffffffffff06c;
  Print *in_stack_fffffffffffff070;
  undefined4 in_stack_fffffffffffff078;
  undefined4 in_stack_fffffffffffff07c;
  undefined4 in_stack_fffffffffffff088;
  int in_stack_fffffffffffff08c;
  ForkJoin *in_stack_fffffffffffff090;
  Print *in_stack_fffffffffffff0b0;
  char *in_stack_fffffffffffff258;
  int in_stack_fffffffffffff264;
  char *in_stack_fffffffffffff268;
  char *in_stack_fffffffffffff270;
  allocator local_cf1;
  string local_cf0 [63];
  allocator local_cb1;
  string local_cb0 [39];
  allocator local_c89;
  string local_c88 [62];
  undefined1 local_c4a;
  allocator local_c49;
  string local_c48 [59];
  undefined1 local_c0d;
  int local_c0c;
  allocator local_c01;
  string local_c00 [32];
  void *local_be0;
  undefined1 local_bd2;
  allocator local_bd1;
  string local_bd0 [32];
  void *local_bb0;
  undefined1 local_ba2;
  allocator local_ba1;
  string local_ba0 [63];
  allocator local_b61;
  string local_b60 [63];
  allocator local_b21;
  string local_b20 [39];
  allocator local_af9;
  string local_af8 [39];
  allocator local_ad1;
  string local_ad0 [32];
  FabArrayBase *local_ab0;
  FabArrayBase *local_aa8;
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [32];
  FabArrayBase *local_a50;
  FabArrayBase *local_a48;
  undefined1 local_a3a;
  allocator local_a39;
  string local_a38 [39];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [36];
  undefined4 local_99c;
  FabArrayBase local_998;
  FabArrayBase local_818;
  FabArrayBase local_698;
  FabArrayBase local_518;
  ForkJoin local_398 [3];
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  byte local_13a;
  byte local_139;
  undefined8 local_f0;
  undefined4 local_e4;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined4 local_c4;
  char *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  undefined4 local_84;
  char *local_80;
  char *local_78;
  undefined8 local_70;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  undefined4 local_44;
  char *local_40;
  char *local_38;
  
  local_139 = in_stack_000000b0 & 1;
  local_13a = in_stack_000000b8 & 1;
  local_140 = amrex::ParallelDescriptor::NProcs();
  piVar2 = std::min<int>(&stack0x00000008,&local_140);
  local_144 = *piVar2;
  local_14c = 1;
  piVar2 = std::max<int>(&local_14c,&(anonymous_namespace)::num_forkjoin_tasks);
  piVar2 = std::min<int>(piVar2,&local_144);
  local_148 = *piVar2;
  if (local_148 == 1) {
    Diffusion::diffuse_scalar
              (in_stack_00002028,in_stack_00002020,in_stack_00002018,in_stack_00002010,
               in_stack_00002008,in_stack_00002004,in_stack_00002070,in_stack_00002078,
               in_stack_00001ff8,in_stack_00001ff0,in_stack_00001fe8,in_stack_00002080,
               in_stack_00002088,in_stack_00002090,in_stack_00002098,in_stack_000020a0,
               in_stack_000020a8,in_stack_000020b0,in_stack_000020b8,in_stack_000020c0,
               in_stack_000020c8,in_stack_000020d0,in_stack_000020d8,in_stack_000020e0,
               in_stack_000020e8,in_stack_000020f0,(bool)in_stack_00001fe7,in_stack_00002100);
  }
  else {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff070,
                        (ostream *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (char (*) [18])CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (int *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (char (*) [22])CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (int *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (char (*) [33])CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (int *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (char (*) [8])CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::Print::~Print(in_stack_fffffffffffff0b0);
    amrex::ForkJoin::ForkJoin(in_stack_fffffffffffff090,in_stack_fffffffffffff08c);
    amrex::ForkJoin::SetVerbose(local_398,(bool)((anonymous_namespace)::forkjoin_verbose & 1));
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
               in_stack_fffffffffffff03c);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
               in_stack_fffffffffffff03c);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
               in_stack_fffffffffffff03c);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
               in_stack_fffffffffffff03c);
    local_99c = 1;
    iVar1 = amrex::FabArrayBase::nGrow(&local_518,0);
    if ((iVar1 < 1) || (iVar1 = amrex::FabArrayBase::nGrow(&local_698,0), iVar1 < 1)) {
      local_38 = "S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1";
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
      ;
      local_44 = 0xbf0;
      local_50 = 0;
      amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                         in_stack_fffffffffffff264,in_stack_fffffffffffff258);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9c0,"S_old_fine",&local_9c1);
    amrex::ForkJoin::reg_mf
              (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
               (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
               (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
    std::__cxx11::string::~string(local_9c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9e8,"S_new_fine",&local_9e9);
    amrex::ForkJoin::reg_mf
              (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
               (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
               (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
    std::__cxx11::string::~string(local_9e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
    if (in_stack_00000020 == 2) {
      iVar1 = amrex::FabArrayBase::nGrow(&local_818,0);
      if ((iVar1 < 1) || (iVar1 = amrex::FabArrayBase::nGrow(&local_998,0), iVar1 < 1)) {
        local_58 = "Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1";
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
        ;
        local_64 = 0xbf4;
        local_70 = 0;
        amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                           in_stack_fffffffffffff264,in_stack_fffffffffffff258);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a10,"Rho_old_fine",&local_a11);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_a10);
      std::allocator<char>::~allocator((allocator<char> *)&local_a11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a38,"Rho_new_fine",&local_a39);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_a38);
      std::allocator<char>::~allocator((allocator<char> *)&local_a39);
    }
    LVar3 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x4fc892);
    local_a3a = 1 < LVar3;
    if ((bool)local_a3a) {
      pFVar4 = (FabArrayBase *)operator_new(0x180);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                 in_stack_fffffffffffff03c);
      local_a48 = pFVar4;
      pFVar4 = (FabArrayBase *)operator_new(0x180);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                 in_stack_fffffffffffff03c);
      local_a50 = pFVar4;
      iVar1 = amrex::FabArrayBase::nGrow(local_a48,0);
      if ((iVar1 < 1) || (iVar1 = amrex::FabArrayBase::nGrow(local_a50,0), iVar1 < 1)) {
        local_78 = "S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1";
        local_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
        ;
        local_84 = 0xbfe;
        local_90 = 0;
        amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                           in_stack_fffffffffffff264,in_stack_fffffffffffff258);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a70,"S_old_crse",&local_a71);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_a70);
      std::allocator<char>::~allocator((allocator<char> *)&local_a71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a98,"S_new_crse",&local_a99);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_a98);
      std::allocator<char>::~allocator((allocator<char> *)&local_a99);
      if (in_stack_00000020 == 2) {
        pFVar4 = (FabArrayBase *)operator_new(0x180);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
        amrex::MultiFab::MultiFab
                  ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                   in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                   in_stack_fffffffffffff03c);
        local_aa8 = pFVar4;
        pFVar4 = (FabArrayBase *)operator_new(0x180);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
        amrex::MultiFab::MultiFab
                  ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                   in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                   in_stack_fffffffffffff03c);
        local_ab0 = pFVar4;
        iVar1 = amrex::FabArrayBase::nGrow(local_aa8,0);
        if ((iVar1 < 1) || (iVar1 = amrex::FabArrayBase::nGrow(local_ab0,0), iVar1 < 1)) {
          local_98 = "Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1";
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
          ;
          local_a4 = 0xc05;
          local_b0 = 0;
          amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                             in_stack_fffffffffffff264,in_stack_fffffffffffff258);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ad0,"Rho_old_crse",&local_ad1);
        amrex::ForkJoin::reg_mf
                  (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                   (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                   (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                   (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
        std::__cxx11::string::~string(local_ad0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_af8,"Rho_new_crse",&local_af9);
        amrex::ForkJoin::reg_mf
                  (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                   (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                   (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                   (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
        std::__cxx11::string::~string(local_af8);
        std::allocator<char>::~allocator((allocator<char> *)&local_af9);
      }
    }
    if (in_stack_00000020 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b20,"rho_half",&local_b21);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_b20);
      std::allocator<char>::~allocator((allocator<char> *)&local_b21);
    }
    GetVecOfPtrs((MultiFab **)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                 (int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b60,"fluxn",&local_b61);
    amrex::ForkJoin::reg_mf_vec
              ((ForkJoin *)in_stack_fffffffffffff070,
               (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
               (string *)in_stack_fffffffffffff060,
               (Strategy)((ulong)in_stack_fffffffffffff058 >> 0x20),
               (Intent)in_stack_fffffffffffff058,in_stack_fffffffffffff054);
    std::__cxx11::string::~string(local_b60);
    std::allocator<char>::~allocator((allocator<char> *)&local_b61);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x4fd0bb);
    GetVecOfPtrs((MultiFab **)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                 (int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ba0,"fluxnp1",&local_ba1);
    amrex::ForkJoin::reg_mf_vec
              ((ForkJoin *)in_stack_fffffffffffff070,
               (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
               (string *)in_stack_fffffffffffff060,
               (Strategy)((ulong)in_stack_fffffffffffff058 >> 0x20),
               (Intent)in_stack_fffffffffffff058,in_stack_fffffffffffff054);
    std::__cxx11::string::~string(local_ba0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x4fd168);
    local_ba2 = 0;
    if (in_stack_00000040 != (FabArrayBase *)0x0) {
      iVar1 = amrex::FabArrayBase::nComp(in_stack_00000040);
      if (iVar1 < in_stack_00000048 + in_stack_00000008) {
        local_b8 = "delta_rhs->nComp() >= rhsComp + num_comp";
        local_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
        ;
        local_c4 = 0xc15;
        local_d0 = 0;
        amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                           in_stack_fffffffffffff264,in_stack_fffffffffffff258);
      }
      pvVar5 = operator_new(0x180);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                 in_stack_fffffffffffff03c);
      local_bb0 = pvVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bd0,"delta_rhs",&local_bd1);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_bd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
      local_ba2 = 1;
    }
    local_bd2 = 0;
    if (in_stack_00000050 != (FabArrayBase *)0x0) {
      iVar1 = amrex::FabArrayBase::nComp(in_stack_00000050);
      if (iVar1 < in_stack_00000058 + in_stack_00000008) {
        local_d8 = "alpha_in->nComp() >= alpha_in_comp + num_comp";
        local_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
        ;
        local_e4 = 0xc1e;
        local_f0 = 0;
        amrex::Assert_host(in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                           in_stack_fffffffffffff264,in_stack_fffffffffffff258);
      }
      pvVar5 = operator_new(0x180);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 in_stack_fffffffffffff048,in_stack_fffffffffffff044,in_stack_fffffffffffff040,
                 in_stack_fffffffffffff03c);
      local_be0 = pvVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c00,"alpha_in",&local_c01);
      amrex::ForkJoin::reg_mf
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                 (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                 (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
                 (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
      std::__cxx11::string::~string(local_c00);
      std::allocator<char>::~allocator((allocator<char> *)&local_c01);
      local_bd2 = 1;
    }
    Diffusion::checkBeta
              ((MultiFab **)in_stack_fffffffffffff048,
               (int *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (int *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    local_c0d = 0;
    bVar6 = local_c0c != 0;
    if (bVar6) {
      GetVecOfPtrs((MultiFab **)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                   (int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c48,"betan",&local_c49);
      amrex::ForkJoin::reg_mf_vec
                ((ForkJoin *)in_stack_fffffffffffff070,
                 (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                 (string *)in_stack_fffffffffffff060,
                 (Strategy)((ulong)in_stack_fffffffffffff058 >> 0x20),
                 (Intent)in_stack_fffffffffffff058,in_stack_fffffffffffff054);
      std::__cxx11::string::~string(local_c48);
      std::allocator<char>::~allocator((allocator<char> *)&local_c49);
      amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 0x4fd6ce);
    }
    local_c0d = bVar6;
    Diffusion::checkBeta
              ((MultiFab **)in_stack_fffffffffffff048,
               (int *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (int *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    local_c4a = 0;
    if (local_c0c != 0) {
      GetVecOfPtrs((MultiFab **)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                   (int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c88,"betanp1",&local_c89);
      amrex::ForkJoin::reg_mf_vec
                ((ForkJoin *)in_stack_fffffffffffff070,
                 (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                 (string *)in_stack_fffffffffffff060,
                 (Strategy)((ulong)in_stack_fffffffffffff058 >> 0x20),
                 (Intent)in_stack_fffffffffffff058,in_stack_fffffffffffff054);
      std::__cxx11::string::~string(local_c88);
      std::allocator<char>::~allocator((allocator<char> *)&local_c89);
      amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 0x4fd80f);
    }
    local_c4a = local_c0c != 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cb0,"volume",&local_cb1);
    amrex::ForkJoin::reg_mf
              (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
               (string *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               (Strategy)((ulong)in_stack_fffffffffffff048 >> 0x20),
               (Intent)in_stack_fffffffffffff048,in_stack_fffffffffffff044);
    std::__cxx11::string::~string(local_cb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
    GetVecOfPtrs((MultiFab **)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                 (int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cf0,"area",&local_cf1);
    amrex::ForkJoin::reg_mf_vec
              ((ForkJoin *)in_stack_fffffffffffff070,
               (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
               (string *)in_stack_fffffffffffff060,
               (Strategy)((ulong)in_stack_fffffffffffff058 >> 0x20),
               (Intent)in_stack_fffffffffffff058,in_stack_fffffffffffff054);
    std::__cxx11::string::~string(local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x4fd99e
              );
    amrex::Vector<int,_std::allocator<int>_>::Vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
    amrex::ForkJoin::
    fork_join<PeleLM::diffuse_scalar_fj(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::Vector<double,std::allocator<double>>const&,int,amrex::MultiFab_const&,amrex::MultiFab_const*const*,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,bool,amrex::Vector<int,std::allocator<int>>const&)::__0>
              (in_stack_fffffffffffff090,
               (anon_class_112_18_4e67f792 *)
               CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088));
    diffuse_scalar_fj(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::Vector<double,std::allocator<double>>const&,int,amrex::MultiFab_const&,amrex::MultiFab_const*const*,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,bool,amrex::Vector<int,std::allocator<int>>const&)
    ::$_0::~__0((anon_class_112_18_4e67f792 *)0x4fdaf8);
    amrex::MultiFab::~MultiFab((MultiFab *)0x4fdb05);
    amrex::MultiFab::~MultiFab((MultiFab *)0x4fdb12);
    amrex::MultiFab::~MultiFab((MultiFab *)0x4fdb1f);
    amrex::MultiFab::~MultiFab((MultiFab *)0x4fdb2c);
    amrex::ForkJoin::~ForkJoin
              ((ForkJoin *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  }
  return;
}

Assistant:

void
PeleLM::diffuse_scalar_fj  (const Vector<MultiFab*>&  S_old,
                            const Vector<MultiFab*>&  Rho_old,
                            Vector<MultiFab*>&        S_new,
                            const Vector<MultiFab*>&  Rho_new,
                            int                       S_comp,
                            int                       num_comp,
                            int                       Rho_comp,
                            Real                      prev_time,
                            Real                      a_time,
                            Real                      a_be_cn_theta,
                            const MultiFab&           rho_mid,
                            int                       rho_flag,
                            MultiFab* const*          fluxn,
                            MultiFab* const*          fluxnp1,
                            int                       fluxComp,
                            MultiFab*                 delta_rhs,
                            int                       rhsComp,
                            const MultiFab*           alpha_in,
                            int                       alpha_in_comp,
                            const MultiFab* const*    betan,
                            const MultiFab* const*    betanp1,
                            int                       betaComp,
                            const Vector<Real>&       a_visc_coef,
                            int                       a_visc_coef_comp,
                            const MultiFab&           theVolume,
                            const MultiFab* const*    theArea,
                            const IntVect&            cratio,
                            const BCRec&              bc,
                            const Geometry&           theGeom,
                            bool                      add_hoop_stress,
                            bool                      add_old_time_divFlux,
                            const amrex::Vector<int>& diffuse_this_comp)
{
  int n_procs = ParallelDescriptor::NProcs();
  int n_tasks_suggest = std::min(num_comp,n_procs);
  int n_tasks = std::min(std::max(1,num_forkjoin_tasks),n_tasks_suggest);

  if (n_tasks == 1)
  {
    diffusion->diffuse_scalar(S_old,Rho_old,S_new,Rho_new,S_comp,num_comp,Rho_comp,
                                  prev_time,a_time,a_be_cn_theta,rho_mid,rho_flag,
                                  fluxn,fluxnp1,fluxComp,delta_rhs,rhsComp,
                                  alpha_in,alpha_in_comp,betan,betanp1,betaComp,
                                  cratio,bc,theGeom,
                                  add_old_time_divFlux,diffuse_this_comp);
  }
  else
  {

    Print() << "Diffusion: using " << n_tasks << " fork-join tasks for "
            << num_comp << " diffusion calls (on a total of " << n_procs << " ranks)" << std::endl;

    ForkJoin fj(n_tasks);
    fj.SetVerbose(forkjoin_verbose);

    MultiFab S_old_fine(*S_old[0], amrex::make_alias, S_comp, num_comp);
    MultiFab S_new_fine(*S_new[0], amrex::make_alias, S_comp, num_comp);
    MultiFab Rho_old_fine(*Rho_old[0], amrex::make_alias, Rho_comp, 1);
    MultiFab Rho_new_fine(*Rho_new[0], amrex::make_alias, Rho_comp, 1);

    const int ng = 1;
    AMREX_ALWAYS_ASSERT(S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1);
    fj.reg_mf(S_old_fine,  "S_old_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::in,    ng);
    fj.reg_mf(S_new_fine,  "S_new_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::inout, ng);
    if (rho_flag == 2) {
      AMREX_ALWAYS_ASSERT(Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1);
      fj.reg_mf(Rho_old_fine,"Rho_old_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      fj.reg_mf(Rho_new_fine,"Rho_new_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
    }

    bool has_coarse_data = S_old.size() > 1;
    if (has_coarse_data) {
      MultiFab *S_old_crse, *S_new_crse;
      S_old_crse = new MultiFab(*S_old[1], amrex::make_alias, S_comp, num_comp);
      S_new_crse = new MultiFab(*S_new[1], amrex::make_alias, S_comp, num_comp);
      AMREX_ALWAYS_ASSERT(S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1);
      fj.reg_mf(*S_old_crse,  "S_old_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      fj.reg_mf(*S_new_crse,  "S_new_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      if (rho_flag == 2) {
        MultiFab *Rho_old_crse, *Rho_new_crse;
        Rho_old_crse = new MultiFab(*Rho_old[1], amrex::make_alias, Rho_comp, 1);
        Rho_new_crse = new MultiFab(*Rho_new[1], amrex::make_alias, Rho_comp, 1);
        AMREX_ALWAYS_ASSERT(Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1);
        fj.reg_mf(*Rho_old_crse,"Rho_old_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
        fj.reg_mf(*Rho_new_crse,"Rho_new_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      }
    }

    if (rho_flag == 1) {
      fj.reg_mf(rho_mid,"rho_half",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    }

    fj.reg_mf_vec(GetVecOfPtrs(fluxn  ,fluxComp,num_comp),"fluxn",  ForkJoin::Strategy::split,ForkJoin::Intent::inout);
    fj.reg_mf_vec(GetVecOfPtrs(fluxnp1,fluxComp,num_comp),"fluxnp1",ForkJoin::Strategy::split,ForkJoin::Intent::inout);

    bool has_delta_rhs = false;
    if (delta_rhs != 0) {
      MultiFab *Rhs;
      AMREX_ALWAYS_ASSERT(delta_rhs->nComp() >= rhsComp + num_comp);
      Rhs = new MultiFab(*delta_rhs, amrex::make_alias, rhsComp, num_comp);
      fj.reg_mf(*Rhs,"delta_rhs",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_delta_rhs = true;
    }

    bool has_alpha_in = false;
    if (alpha_in != 0) {
      MultiFab *Alpha;
      AMREX_ALWAYS_ASSERT(alpha_in->nComp() >= alpha_in_comp + num_comp);
      Alpha = new MultiFab(*alpha_in, amrex::make_alias, alpha_in_comp, num_comp);
      fj.reg_mf(*Alpha,"alpha_in",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_alpha_in = true;
    }

    int allnull, allthere;
    Diffusion::checkBeta(betan,   allthere, allnull);
    bool has_betan = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betan,  betaComp,num_comp),"betan",  ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betan = true;
    }

    Diffusion::checkBeta(betanp1, allthere, allnull);
    bool has_betanp1 = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betanp1,betaComp,num_comp),"betanp1",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betanp1 = true;
    }

    fj.reg_mf(theVolume,"volume",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    fj.reg_mf_vec(GetVecOfPtrs(theArea,0,1),"area",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);

    fj.fork_join(
      [=,&bc,&theGeom,&a_visc_coef] (ForkJoin &f)
      {
        diffusionFJDriver(f,
                          prev_time,
                          a_time,
                          a_be_cn_theta,
                          rho_flag,
                          a_visc_coef,
                          a_visc_coef_comp,
                          cratio,
                          bc,
                          theGeom,
                          add_hoop_stress,
                          add_old_time_divFlux,
                          diffuse_this_comp,
                          has_coarse_data, has_delta_rhs, has_alpha_in, has_betan, has_betanp1);
      }
      );
  }
}